

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_extension.cc
# Opt level: O2

void google::protobuf::compiler::javanano::SetVariables
               (FieldDescriptor *descriptor,Params *params,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  int iVar1;
  bool bVar2;
  Type TVar3;
  JavaType JVar4;
  uint32 uVar5;
  mapped_type *pmVar6;
  LogMessage *other;
  Params *params_00;
  Descriptor *in_RCX;
  Descriptor *descriptor_00;
  uint i;
  JavaType type;
  uint i_00;
  uint i_01;
  FieldDescriptor *field;
  key_type *this;
  string *this_00;
  allocator<char> local_129;
  string message_type;
  key_type local_108;
  key_type local_e8;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  key_type local_50;
  
  ClassName_abi_cxx11_(&tag,(javanano *)params,*(Params **)(descriptor + 0x58),in_RCX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message_type,"extends",(allocator<char> *)&local_108);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&message_type);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&tag);
  std::__cxx11::string::~string((string *)&message_type);
  std::__cxx11::string::~string((string *)&tag);
  UnderscoresToCamelCase_abi_cxx11_(&message_type,(javanano *)descriptor,field);
  RenameJavaKeywords(&tag,&message_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"name",(allocator<char> *)&local_e8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_108);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&tag);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&tag);
  std::__cxx11::string::~string((string *)&message_type);
  iVar1 = *(int *)(descriptor + 0x4c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tag,"repeated",(allocator<char> *)&message_type);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&tag);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&tag);
  TVar3 = FieldDescriptor::type(descriptor);
  if (TVar3 - TYPE_DOUBLE < 0x12) {
    descriptor_00 = (Descriptor *)&DAT_0038c4a8;
  }
  else {
    descriptor_00 = (Descriptor *)0x4a;
    internal::LogMessage::LogMessage
              ((LogMessage *)&tag,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_extension.cc"
               ,0x4a);
    other = internal::LogMessage::operator<<((LogMessage *)&tag,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&message_type,other);
    internal::LogMessage::~LogMessage((LogMessage *)&tag);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tag,"type",(allocator<char> *)&message_type);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&tag);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&tag);
  TVar3 = FieldDescriptor::type(descriptor);
  JVar4 = GetJavaType(TVar3);
  uVar5 = internal::WireFormat::MakeTag(descriptor);
  SimpleItoa_abi_cxx11_(&tag,(protobuf *)(ulong)uVar5,i);
  if (JVar4 == JAVATYPE_MESSAGE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_type,"ext_type",(allocator<char> *)&local_108);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&message_type);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&message_type);
    params_00 = (Params *)FieldDescriptor::message_type(descriptor);
    ClassName_abi_cxx11_(&message_type,(javanano *)params,params_00,descriptor_00);
    if (iVar1 == 3) {
      std::__cxx11::string::append((char *)&message_type);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"class",(allocator<char> *)&local_e8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_108);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"tag_params",(allocator<char> *)&local_e8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_108);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    this = &local_108;
LAB_002b9933:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_type,"ext_type",(allocator<char> *)&local_108);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&message_type);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&message_type);
    if (iVar1 == 3) {
      PrimitiveTypeName_abi_cxx11_(&local_108,(javanano *)(ulong)JVar4,type);
      std::operator+(&message_type,&local_108,"[]");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"class",(allocator<char> *)&local_90);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_e8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&message_type);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&message_type);
      std::__cxx11::string::~string((string *)&local_108);
      bVar2 = FieldDescriptor::is_packable(descriptor);
      if (!bVar2) {
        std::operator+(&local_e8,&tag,", ");
        std::operator+(&local_108,&local_e8,&tag);
        std::operator+(&message_type,&local_108,", 0");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"tag_params",(allocator<char> *)&local_70);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,&local_90);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&message_type);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&message_type);
        std::__cxx11::string::~string((string *)&local_108);
        this_00 = &local_e8;
        goto LAB_002b9b53;
      }
      if (*(char *)(*(long *)(descriptor + 0x80) + 0x6c) == '\x01') {
        iVar1 = *(int *)(descriptor + 0x38);
        TVar3 = FieldDescriptor::type(descriptor);
        SimpleItoa_abi_cxx11_
                  (&message_type,
                   (protobuf *)
                   (ulong)(iVar1 << 3 |
                          *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                   (ulong)TVar3 * 4)),i_01);
        std::operator+(&local_70,&tag,", ");
        std::operator+(&local_90,&local_70,&message_type);
        std::operator+(&local_e8,&local_90,", ");
        std::operator+(&local_108,&local_e8,&tag);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"tag_params",&local_129);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,&local_50);
      }
      else {
        SimpleItoa_abi_cxx11_
                  (&message_type,(protobuf *)(ulong)(*(int *)(descriptor + 0x38) * 8 + 2),i_00);
        std::operator+(&local_70,&tag,", ");
        std::operator+(&local_90,&local_70,&tag);
        std::operator+(&local_e8,&local_90,", ");
        std::operator+(&local_108,&local_e8,&message_type);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"tag_params",&local_129);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,&local_50);
      }
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_90);
      this = &local_70;
      goto LAB_002b9933;
    }
    BoxedPrimitiveTypeName_abi_cxx11_(&message_type,(javanano *)(ulong)JVar4,type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"class",(allocator<char> *)&local_e8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_108);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&message_type);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&message_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_type,"tag_params",(allocator<char> *)&local_108);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&message_type);
    std::__cxx11::string::_M_assign((string *)pmVar6);
  }
  this_00 = &message_type;
LAB_002b9b53:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&tag);
  return;
}

Assistant:

void SetVariables(const FieldDescriptor* descriptor, const Params params,
                  map<string, string>* variables) {
  (*variables)["extends"] = ClassName(params, descriptor->containing_type());
  (*variables)["name"] = RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  bool repeated = descriptor->is_repeated();
  (*variables)["repeated"] = repeated ? "Repeated" : "";
  (*variables)["type"] = GetTypeConstantName(descriptor->type());
  JavaType java_type = GetJavaType(descriptor->type());
  string tag = SimpleItoa(WireFormat::MakeTag(descriptor));
  if (java_type == JAVATYPE_MESSAGE) {
    (*variables)["ext_type"] = "MessageTyped";
    string message_type = ClassName(params, descriptor->message_type());
    if (repeated) {
      message_type += "[]";
    }
    (*variables)["class"] = message_type;
    // For message typed extensions, tags_params contains a single tag
    // for both singular and repeated cases.
    (*variables)["tag_params"] = tag;
  } else {
    (*variables)["ext_type"] = "PrimitiveTyped";
    if (!repeated) {
      (*variables)["class"] = BoxedPrimitiveTypeName(java_type);
      (*variables)["tag_params"] = tag;
    } else {
      (*variables)["class"] = PrimitiveTypeName(java_type) + "[]";
      if (!descriptor->is_packable()) {
        // Non-packable: nonPackedTag == tag, packedTag == 0
        (*variables)["tag_params"] = tag + ", " + tag + ", 0";
      } else if (descriptor->options().packed()) {
        // Packable and packed: tag == packedTag
        string non_packed_tag = SimpleItoa(WireFormatLite::MakeTag(
            descriptor->number(),
            WireFormat::WireTypeForFieldType(descriptor->type())));
        (*variables)["tag_params"] = tag + ", " + non_packed_tag + ", " + tag;
      } else {
        // Packable and not packed: tag == nonPackedTag
        string packed_tag = SimpleItoa(WireFormatLite::MakeTag(
            descriptor->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        (*variables)["tag_params"] = tag + ", " + tag + ", " + packed_tag;
      }
    }
  }
}